

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.h
# Opt level: O2

uint __thiscall CVmObjCharSet::calc_hash(CVmObjCharSet *this,vm_obj_id_t self,int param_2)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  
  pcVar1 = (this->super_CVmObject).ext_;
  uVar2 = 0;
  for (lVar3 = 0; *(long *)(pcVar1 + 0x10) != lVar3; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 + (int)pcVar1[lVar3 + 0x18];
  }
  return uVar2;
}

Assistant:

const struct vmobj_charset_ext_t *get_ext_ptr() const
        { return (vmobj_charset_ext_t *)ext_; }